

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobatto_polynomial.cpp
# Opt level: O2

double * lobatto_polynomial_derivative(int m,int n,double *x)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  void *pvVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  int iVar11;
  long lVar12;
  double *pdVar13;
  void *pvVar14;
  void *pvVar15;
  double *pdVar16;
  void *pvVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long local_60;
  double *local_58;
  
  uVar19 = (ulong)(uint)n;
  uVar6 = (ulong)(uint)(n * m) * 8;
  if (n * m < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar6);
  uVar2 = (n + 1) * m;
  uVar6 = (ulong)uVar2 * 8;
  if ((int)uVar2 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pdVar4 = (double *)operator_new__(uVar6);
  pvVar5 = operator_new__(uVar6);
  lVar8 = (long)m;
  local_60 = 0;
  uVar6 = 0;
  if (0 < m) {
    uVar6 = (ulong)(uint)m;
  }
  pvVar7 = (void *)(lVar8 * 8 + (long)pvVar5);
  pvVar17 = (void *)((long)pvVar5 + lVar8 * 0x10);
  pdVar13 = pdVar3 + lVar8;
  pdVar16 = pdVar4 + lVar8 * 2;
  pvVar14 = pvVar7;
  pvVar15 = pvVar17;
  local_58 = pdVar4;
  for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
    if (0 < n) {
      dVar1 = x[uVar9];
      pdVar3[uVar9] = dVar1 * -2.0;
      if (n != 1) {
        pdVar4[uVar9] = 1.0;
        pdVar4[uVar9 + lVar8] = dVar1;
        iVar11 = 2;
        iVar18 = 3;
        pdVar10 = local_58;
        for (uVar20 = 1; uVar19 != uVar20; uVar20 = uVar20 + 1) {
          pdVar10[lVar8 * 2] =
               ((double)iVar18 * dVar1 * pdVar10[lVar8] - (double)(int)uVar20 * *pdVar10) /
               (double)iVar11;
          pdVar10 = pdVar10 + lVar8;
          iVar18 = iVar18 + 2;
          iVar11 = iVar11 + 1;
        }
        *(undefined8 *)((long)pvVar5 + uVar9 * 8) = 0;
        *(undefined8 *)((long)pvVar5 + (uVar9 + lVar8) * 8) = 0x3ff0000000000000;
        iVar11 = 2;
        iVar18 = 3;
        lVar12 = local_60;
        for (uVar20 = 1; uVar19 != uVar20; uVar20 = uVar20 + 1) {
          *(double *)((long)pvVar17 + lVar12) =
               ((*(double *)((long)pvVar7 + lVar12) * dVar1 +
                *(double *)((long)pdVar4 + lVar12 + lVar8 * 8)) * (double)iVar18 -
               (double)(int)uVar20 * *(double *)((long)pvVar5 + lVar12)) / (double)iVar11;
          iVar18 = iVar18 + 2;
          lVar12 = lVar12 + lVar8 * 8;
          iVar11 = iVar11 + 1;
        }
        lVar12 = 0;
        uVar20 = 1;
        while (uVar19 != uVar20) {
          uVar20 = uVar20 + 1;
          *(double *)((long)pdVar13 + lVar12) =
               (*(double *)((long)pvVar15 + lVar12) * -dVar1 +
               (*(double *)((long)pvVar14 + lVar12) - *(double *)((long)pdVar16 + lVar12))) *
               (double)(int)uVar20;
          lVar12 = lVar12 + lVar8 * 8;
        }
      }
    }
    local_58 = local_58 + 1;
    local_60 = local_60 + 8;
    pvVar14 = (void *)((long)pvVar14 + 8);
    pdVar13 = pdVar13 + 1;
    pdVar16 = pdVar16 + 1;
    pvVar15 = (void *)((long)pvVar15 + 8);
  }
  operator_delete__(pdVar4);
  operator_delete__(pvVar5);
  return pdVar3;
}

Assistant:

double *lobatto_polynomial_derivative ( int m, int n, double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    LOBATTO_POLYNOMIAL_DERIVATIVE: derivative of completed Lobatto polynomial.
//
//  Discussion:
//
//    L(N,X)  =  N * ( P(N-1,X) - X * P(N,X) )
//    L'(N,X) =  N * ( P'(N-1,X) - P(N,X) - X * P'(N,X) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 November 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Larry Andrews,
//    Special Functions of Mathematics for Engineers,
//    Second Edition,
//    Oxford University Press, 1998,
//    ISBN: 0819426164,
//    LC: QA351.A75.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996.
//
//  Parameters:
//
//    Input, int M, the number of evaluation points.
//
//    Input, int N, the highest order polynomial to evaluate.
//    Note that polynomials 0 through N will be evaluated.
//
//    Input, double X[M], the evaluation points.
//
//    Output, double LOBATTO_POLYNOMIAL_DERIVATIVE[M*N], the derivative of
//    the completed Lobatto polynomials of order 1 through N at the point X.
//
{
  int i;
  int j;
  double *lp;
  double *p;
  double *pp;

  lp = new double[m*n];
  p = new double[m*(n+1)];
  pp = new double[m*(n+1)];

  for ( i = 0; i < m; i++ )
  {
    if ( 1 <= n )
    {
      lp[i+0*m] = - 2.0 * x[i];

      if ( 2 <= n )
      {
        p[i+0*m] = 1.0;
        p[i+1*m] = x[i];
        for ( j = 1; j < n; j++ )
        {
          p[i+(j+1)*m] =
            ( double( 2 * j + 1 ) * x[i] * p[i+j*m]
            - double(     j     ) *        p[i+(j-1)*m] )
            / double(     j + 1 );
        }

        pp[i+0*m] = 0.0;
        pp[i+1*m] = 1.0;
        for ( j = 1; j < n; j++ )
        {
          pp[i+(j+1)*m] =
            ( double( 2 * j + 1 ) * ( p[i+j*m] + x[i] * pp[i+j*m] )
            - double(     j     ) *                     pp[i+(j-1)*m] )
            / double(     j + 1 );
        }

        for ( j = 1; j < n; j++ )
        {
          lp[i+j*m] =
            double( j + 1 )
            * ( pp[i+j*m] - p[i+(j+1)*m] - x[i] * pp[i+(j+1)*m] );
        }
      }
    }
  }

  delete [] p;
  delete [] pp;

  return lp;
}